

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O0

void __thiscall MIDISong2::AdvanceTracks(MIDISong2 *this,DWORD time)

{
  int local_18;
  int i;
  DWORD time_local;
  MIDISong2 *this_local;
  
  for (local_18 = 0; local_18 < this->NumTracks; local_18 = local_18 + 1) {
    if ((this->Tracks[local_18].Finished & 1U) == 0) {
      this->Tracks[local_18].Delay = this->Tracks[local_18].Delay - time;
      this->Tracks[local_18].PlayedTime = time + this->Tracks[local_18].PlayedTime;
    }
  }
  return;
}

Assistant:

void MIDISong2::AdvanceTracks(DWORD time)
{
	for (int i = 0; i < NumTracks; ++i)
	{
		if (!Tracks[i].Finished)
		{
			Tracks[i].Delay -= time;
			Tracks[i].PlayedTime += time;
		}
	}
}